

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DC8uvNoTop_C(uint8_t *dst)

{
  long in_RDI;
  int i;
  int dc0;
  uint8_t *in_stack_ffffffffffffffe8;
  undefined4 local_10;
  int iVar1;
  
  iVar1 = 4;
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    iVar1 = (uint)*(byte *)(in_RDI + (local_10 * 0x20 + -1)) + iVar1;
  }
  Put8x8uv((uint8_t)((uint)iVar1 >> 0x18),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void DC8uvNoTop_C(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv(dc0 >> 3, dst);
}